

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringData.cpp
# Opt level: O2

void __thiscall StringData::printStringDataUtil(StringData *this,StringDataStruct *sdStruct)

{
  int iVar1;
  ostream *poVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
             &sdStruct->CountCharacters);
  iVar1 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"      CountCharacters:              ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," Unicode characters, ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 * 2);
  poVar2 = std::operator<<(poVar2," bytes. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"      String:                       ");
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  Utils::print_vec_unicode(&sdStruct->String);
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (sdStruct->String).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void StringData::printStringDataUtil(StringDataStruct sdStruct) {
    int len = Utils::lenTwoBytes(sdStruct.CountCharacters);
    cout << "      CountCharacters:              " << dec << len << " Unicode characters, "
         << dec << len * 2 << " bytes. " << endl;
    cout << "      String:                       ";
    reverse(sdStruct.String.begin(), sdStruct.String.end());
    Utils::print_vec_unicode(sdStruct.String);
    reverse(sdStruct.String.begin(), sdStruct.String.end());
}